

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DancingNode.cpp
# Opt level: O0

void cover(DancingNode *targetDancingNode,
          vector<std::vector<s_DancingNode,_std::allocator<s_DancingNode>_>,_std::allocator<std::vector<s_DancingNode,_std::allocator<s_DancingNode>_>_>_>
          *Matrix)

{
  s_DancingNode *psVar1;
  reference this;
  reference pvVar2;
  DancingNode *colDancingNode;
  DancingNode *rightDancingNode;
  DancingNode *row;
  vector<std::vector<s_DancingNode,_std::allocator<s_DancingNode>_>,_std::allocator<std::vector<s_DancingNode,_std::allocator<s_DancingNode>_>_>_>
  *Matrix_local;
  DancingNode *targetDancingNode_local;
  
  psVar1 = targetDancingNode->column;
  psVar1->left->right = psVar1->right;
  psVar1->right->left = psVar1->left;
  for (rightDancingNode = psVar1->down; rightDancingNode != psVar1;
      rightDancingNode = rightDancingNode->down) {
    for (colDancingNode = rightDancingNode->right; colDancingNode != rightDancingNode;
        colDancingNode = colDancingNode->right) {
      colDancingNode->up->down = colDancingNode->down;
      colDancingNode->down->up = colDancingNode->up;
      this = std::
             vector<std::vector<s_DancingNode,_std::allocator<s_DancingNode>_>,_std::allocator<std::vector<s_DancingNode,_std::allocator<s_DancingNode>_>_>_>
             ::operator[](Matrix,0);
      pvVar2 = std::vector<s_DancingNode,_std::allocator<s_DancingNode>_>::operator[]
                         (this,(long)colDancingNode->col);
      pvVar2->nodeCount = pvVar2->nodeCount + -1;
    }
  }
  return;
}

Assistant:

void cover(DancingNode *targetDancingNode, vector<vector<DancingNode>> &Matrix) 
{ 
    DancingNode *row, *rightDancingNode; 
  
    // get the pointer to the header of column 
    // to which this node belong  
    DancingNode *colDancingNode = targetDancingNode->column; 
  
    // unlink column header from it's neighbors 
    colDancingNode->left->right = colDancingNode->right; 
    colDancingNode->right->left = colDancingNode->left; 
  
    // Move down the column and remove each row 
    // by traversing right 
    for(row = colDancingNode->down; row != colDancingNode; row = row->down) 
    { 
        for(rightDancingNode = row->right; rightDancingNode != row; 
            rightDancingNode = rightDancingNode->right) 
        { 
            rightDancingNode->up->down = rightDancingNode->down; 
            rightDancingNode->down->up = rightDancingNode->up; 
  
            // after unlinking row node, decrement the 
            // node count in column header 
            Matrix[0][rightDancingNode->col].nodeCount -= 1; 
        } 
    } 
}